

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O1

bool crnlib::image_utils::write_to_file
               (char *pFilename,image_u8 *img,uint write_flags,int grayscale_comp_index)

{
  uchar uVar1;
  uint uVar2;
  color_quad<unsigned_char,_int> *pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  elemental_vector *peVar7;
  void *pData;
  uint uVar8;
  color_quad<unsigned_char,_int> *pcVar9;
  ulong uVar10;
  uchar *puVar11;
  undefined2 *puVar12;
  long lVar13;
  code *pcVar14;
  ulong uVar15;
  undefined4 uVar16;
  uint uVar17;
  undefined7 uVar18;
  vector<unsigned_char> temp;
  params params;
  dynamic_string ext;
  elemental_vector local_68;
  params local_58;
  dynamic_string local_48;
  undefined4 local_34;
  
  if (grayscale_comp_index - 4U < 0xfffffffb) {
    return false;
  }
  if (img->m_width == 0) {
    return false;
  }
  dynamic_string::dynamic_string(&local_48,pFilename);
  bVar4 = file_utils::get_extension(&local_48);
  if (bVar4) {
    iVar5 = dynamic_string::compare(&local_48,"jpg",false);
    uVar18 = (undefined7)((ulong)&local_48 >> 8);
    if (iVar5 == 0) {
      uVar16 = (undefined4)CONCAT71(uVar18,1);
    }
    else {
      iVar5 = dynamic_string::compare(&local_48,"jpeg",false);
      uVar16 = (undefined4)CONCAT71(uVar18,iVar5 == 0);
    }
    iVar5 = dynamic_string::compare(&local_48,"png",false);
    if (((iVar5 != 0) && (iVar5 = dynamic_string::compare(&local_48,"bmp",false), iVar5 != 0)) &&
       (iVar5 = dynamic_string::compare(&local_48,"tga",false), iVar5 != 0 && (char)uVar16 == '\0'))
    {
      bVar4 = false;
      console::error(
                    "crnlib::image_utils::write_to_file: Can only write .BMP, .TGA, .PNG, or .JPG files!\n"
                    );
      goto LAB_00118dd5;
    }
  }
  else {
    uVar16 = 0;
  }
  local_68.m_p = (void *)0x0;
  local_68.m_size = 0;
  local_68.m_capacity = 0;
  local_34 = uVar16;
  if ((write_flags & 2) == 0 && (img->m_comp_flags & 0x10) == 0) {
    if (((char)uVar16 == '\0' && (write_flags & 1) == 0) && (img->m_comp_flags & 8) != 0) {
      iVar5 = 4;
      peVar7 = (elemental_vector *)&img->m_pPixels;
    }
    else {
      uVar17 = img->m_width * img->m_height * 3;
      if (uVar17 != 0) {
        if (uVar17 != 0) {
          elemental_vector::increase_capacity
                    (&local_68,uVar17,uVar17 == 1,1,(object_mover)0x0,false);
        }
        memset((void *)((long)local_68.m_p + (local_68._8_8_ & 0xffffffff)),0,
               (ulong)(uVar17 - local_68.m_size));
        local_68.m_size = uVar17;
      }
      iVar5 = 3;
      peVar7 = &local_68;
      if (img->m_height != 0) {
        uVar8 = 0;
        do {
          uVar2 = img->m_width;
          if ((ulong)uVar2 != 0) {
            pcVar9 = img->m_pPixels + img->m_pitch * uVar8;
            pcVar3 = pcVar9 + uVar2;
            puVar12 = (undefined2 *)((long)local_68.m_p + (ulong)(uVar2 * uVar8 * 3));
            do {
              uVar1 = (pcVar9->field_0).field_0.b;
              *puVar12 = *(undefined2 *)&pcVar9->field_0;
              *(uchar *)(puVar12 + 1) = uVar1;
              puVar12 = (undefined2 *)((long)puVar12 + 3);
              pcVar9 = pcVar9 + 1;
            } while (pcVar9 != pcVar3);
          }
          uVar8 = uVar8 + 1;
          peVar7 = &local_68;
        } while (uVar8 < img->m_height);
      }
    }
  }
  else {
    uVar17 = img->m_height * img->m_width;
    if (uVar17 != 0) {
      if (uVar17 != 0) {
        elemental_vector::increase_capacity(&local_68,uVar17,uVar17 == 1,1,(object_mover)0x0,false);
      }
      memset((void *)((long)local_68.m_p + (local_68._8_8_ & 0xffffffff)),0,
             (ulong)(uVar17 - local_68.m_size));
      local_68.m_size = uVar17;
    }
    iVar5 = 1;
    peVar7 = &local_68;
    if (img->m_height != 0) {
      uVar8 = 0;
      do {
        pcVar3 = img->m_pPixels;
        uVar2 = img->m_width;
        uVar10 = (ulong)uVar2;
        uVar15 = (ulong)(img->m_pitch * uVar8);
        puVar11 = (uchar *)((long)local_68.m_p + (ulong)(uVar2 * uVar8));
        if ((img->m_comp_flags & 0x10) == 0) {
          if (grayscale_comp_index < 0) {
            if (uVar10 != 0) {
              lVar13 = 0;
              do {
                pcVar9 = pcVar3 + uVar15 + lVar13;
                *(char *)((long)local_68.m_p + lVar13 + (ulong)(uVar2 * uVar8)) =
                     (char)((uint)(pcVar9->field_0).field_0.b * 0x1d2f +
                            (uint)(pcVar9->field_0).field_0.g * 0x9646 +
                            (uint)(pcVar9->field_0).field_0.r * 0x4c8b + 0x8000 >> 0x10);
                lVar13 = lVar13 + 1;
              } while (pcVar9 + 1 != pcVar3 + uVar15 + uVar10);
            }
          }
          else if (uVar10 != 0) {
            lVar13 = 0;
            do {
              *puVar11 = pcVar3[uVar15].field_0.c[lVar13 + (ulong)(uint)grayscale_comp_index];
              puVar11 = puVar11 + 1;
              lVar13 = lVar13 + 4;
            } while (uVar10 << 2 != lVar13);
          }
        }
        else if (uVar10 != 0) {
          lVar13 = 0;
          do {
            *puVar11 = pcVar3[uVar15].field_0.c[lVar13 + 1];
            puVar11 = puVar11 + 1;
            lVar13 = lVar13 + 4;
          } while (uVar10 << 2 != lVar13);
        }
        uVar8 = uVar8 + 1;
        peVar7 = &local_68;
      } while (uVar8 < img->m_height);
    }
  }
  pcVar3 = *(color_quad<unsigned_char,_int> **)peVar7;
  iVar6 = dynamic_string::compare(&local_48,"png",false);
  if (iVar6 == 0) {
    local_58.m_quality = 0;
    local_58.m_subsampling = Y_ONLY;
    pData = tdefl_write_image_to_png_file_in_memory
                      (pcVar3,img->m_width,img->m_height,iVar5,(size_t *)&local_58);
    if (pData == (void *)0x0) {
      bVar4 = false;
    }
    else {
      bVar4 = file_utils::write_buf_to_file(pFilename,pData,local_58._0_8_);
      mz_free(pData);
    }
    bVar4 = (bool)(pData != (void *)0x0 & bVar4);
  }
  else if ((char)local_34 == '\0') {
    iVar6 = dynamic_string::compare(&local_48,"bmp",false);
    pcVar14 = stbi_write_tga;
    if (iVar6 == 0) {
      pcVar14 = stbi_write_bmp;
    }
    iVar5 = (*pcVar14)(pFilename,img->m_width,img->m_height,iVar5,pcVar3);
    bVar4 = iVar5 == 1;
  }
  else {
    local_58.m_quality = 0x55;
    local_58.m_subsampling = H2V2;
    local_58.m_use_std_tables = false;
    if (0xffffff < write_flags) {
      local_58.m_quality = 100;
      if (write_flags >> 0x18 < 100) {
        local_58.m_quality = write_flags >> 0x18;
      }
      local_58.m_subsampling = 3;
    }
    local_58._8_2_ = CONCAT11((char)(write_flags >> 0x13),(char)(write_flags >> 0x14)) & 0x101;
    uVar16 = 1;
    if ((((write_flags >> 0x10 & 1) != 0) || (uVar16 = 2, (write_flags >> 0x11 & 1) != 0)) ||
       (uVar16 = 3, (write_flags >> 0x12 & 1) != 0)) {
      local_58.m_subsampling = uVar16;
    }
    bVar4 = jpge::compress_image_to_jpeg_file
                      (pFilename,img->m_width,img->m_height,iVar5,(uint8 *)pcVar3,&local_58);
  }
  if (local_68.m_p != (void *)0x0) {
    crnlib_free(local_68.m_p);
  }
LAB_00118dd5:
  if ((local_48.m_pStr != (char *)0x0) &&
     ((*(uint *)(local_48.m_pStr + -8) ^ *(uint *)(local_48.m_pStr + -4)) == 0xffffffff)) {
    crnlib_free(local_48.m_pStr + -0x10);
  }
  return bVar4;
}

Assistant:

bool write_to_file(const char* pFilename, const image_u8& img, uint write_flags, int grayscale_comp_index)
        {
            if ((grayscale_comp_index < -1) || (grayscale_comp_index > 3))
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            if (!img.get_width())
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            dynamic_string ext(pFilename);
            bool is_jpeg = false;
            if (file_utils::get_extension(ext))
            {
                is_jpeg = ((ext == "jpg") || (ext == "jpeg"));

                if ((ext != "png") && (ext != "bmp") && (ext != "tga") && (!is_jpeg))
                {
                    console::error("crnlib::image_utils::write_to_file: Can only write .BMP, .TGA, .PNG, or .JPG files!\n");
                    return false;
                }
            }

            crnlib::vector<uint8> temp;
            uint num_src_chans = 0;
            const void* pSrc_img = nullptr;

            if (is_jpeg)
            {
                write_flags |= cWriteFlagIgnoreAlpha;
            }

            if ((img.get_comp_flags() & pixel_format_helpers::cCompFlagGrayscale) || (write_flags & image_utils::cWriteFlagGrayscale))
            {
                CRNLIB_ASSERT(grayscale_comp_index < 4);
                if (grayscale_comp_index > 3)
                {
                    grayscale_comp_index = 3;
                }

                temp.resize(img.get_total_pixels());

                for (uint y = 0; y < img.get_height(); y++)
                {
                    const color_quad_u8* pSrc = img.get_scanline(y);
                    const color_quad_u8* pSrc_end = pSrc + img.get_width();
                    uint8* pDst = &temp[y * img.get_width()];

                    if (img.get_comp_flags() & pixel_format_helpers::cCompFlagGrayscale)
                    {
                        while (pSrc != pSrc_end)
                        {
                            *pDst++ = (*pSrc++)[1];
                        }
                    }
                    else if (grayscale_comp_index < 0)
                    {
                        while (pSrc != pSrc_end)
                        {
                            *pDst++ = static_cast<uint8>((*pSrc++).get_luma());
                        }
                    }
                    else
                    {
                        while (pSrc != pSrc_end)
                        {
                            *pDst++ = (*pSrc++)[grayscale_comp_index];
                        }
                    }
                }

                pSrc_img = &temp[0];
                num_src_chans = 1;
            }
            else if ((!img.is_component_valid(3)) || (write_flags & cWriteFlagIgnoreAlpha))
            {
                temp.resize(img.get_total_pixels() * 3);

                for (uint y = 0; y < img.get_height(); y++)
                {
                    const color_quad_u8* pSrc = img.get_scanline(y);
                    const color_quad_u8* pSrc_end = pSrc + img.get_width();
                    uint8* pDst = &temp[y * img.get_width() * 3];

                    while (pSrc != pSrc_end)
                    {
                        const color_quad_u8 c(*pSrc++);

                        pDst[0] = c.r;
                        pDst[1] = c.g;
                        pDst[2] = c.b;

                        pDst += 3;
                    }
                }

                num_src_chans = 3;
                pSrc_img = &temp[0];
            }
            else
            {
                num_src_chans = 4;
                pSrc_img = img.get_ptr();
            }

            bool success = false;
            if (ext == "png")
            {
                size_t png_image_size = 0;
                void* pPNG_image_data = tdefl_write_image_to_png_file_in_memory(pSrc_img, img.get_width(), img.get_height(), num_src_chans, &png_image_size);
                if (!pPNG_image_data)
                {
                    return false;
                }
                success = file_utils::write_buf_to_file(pFilename, pPNG_image_data, png_image_size);
                mz_free(pPNG_image_data);
            }
            else if (is_jpeg)
            {
                jpge::params params;
                if (write_flags & cWriteFlagJPEGQualityLevelMask)
                {
                    params.m_quality = math::clamp<uint>((write_flags & cWriteFlagJPEGQualityLevelMask) >> cWriteFlagJPEGQualityLevelShift, 1U, 100U);
                }
                params.m_two_pass_flag = (write_flags & cWriteFlagJPEGTwoPass) != 0;
                params.m_no_chroma_discrim_flag = (write_flags & cWriteFlagJPEGNoChromaDiscrim) != 0;

                if (write_flags & cWriteFlagJPEGH1V1)
                {
                    params.m_subsampling = jpge::H1V1;
                }
                else if (write_flags & cWriteFlagJPEGH2V1)
                {
                    params.m_subsampling = jpge::H2V1;
                }
                else if (write_flags & cWriteFlagJPEGH2V2)
                {
                    params.m_subsampling = jpge::H2V2;
                }

                success = jpge::compress_image_to_jpeg_file(pFilename, img.get_width(), img.get_height(), num_src_chans, (const jpge::uint8*)pSrc_img, params);
            }
            else
            {
                success = ((ext == "bmp" ? stbi_write_bmp : stbi_write_tga)(pFilename, img.get_width(), img.get_height(), num_src_chans, pSrc_img) == CRNLIB_TRUE);
            }
            return success;
        }